

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyname.c
# Opt level: O0

ares_status_t
ares_gethostbyname_file_int(ares_channel_t *channel,char *name,int family,hostent **host)

{
  ares_bool_t aVar1;
  ares_status_t local_3c;
  ares_hosts_entry_t *paStack_38;
  ares_status_t status;
  ares_hosts_entry_t *entry;
  hostent **host_local;
  char *pcStack_20;
  int family_local;
  char *name_local;
  ares_channel_t *channel_local;
  
  if (((channel == (ares_channel_t *)0x0) || (name == (char *)0x0)) || (host == (hostent **)0x0)) {
    if (host != (hostent **)0x0) {
      *host = (hostent *)0x0;
    }
    channel_local._4_4_ = ARES_ENOTFOUND;
  }
  else {
    *host = (hostent *)0x0;
    entry = (ares_hosts_entry_t *)host;
    host_local._4_4_ = family;
    pcStack_20 = name;
    name_local = (char *)channel;
    aVar1 = ares_is_onion_domain(name);
    if (aVar1 == ARES_FALSE) {
      local_3c = ares_hosts_search_host
                           ((ares_channel_t *)name_local,ARES_FALSE,pcStack_20,
                            &stack0xffffffffffffffc8);
      if (local_3c == ARES_SUCCESS) {
        local_3c = ares_hosts_entry_to_hostent(paStack_38,host_local._4_4_,(hostent **)entry);
      }
      if ((local_3c == ARES_ENOMEM) || (aVar1 = ares_is_localhost(pcStack_20), aVar1 == ARES_FALSE))
      {
        channel_local._4_4_ = local_3c;
      }
      else {
        channel_local._4_4_ = ares_hostent_localhost(pcStack_20,host_local._4_4_,(hostent **)entry);
      }
    }
    else {
      channel_local._4_4_ = ARES_ENOTFOUND;
    }
  }
  return channel_local._4_4_;
}

Assistant:

static ares_status_t ares_gethostbyname_file_int(ares_channel_t *channel,
                                                 const char *name, int family,
                                                 struct hostent **host)
{
  const ares_hosts_entry_t *entry;
  ares_status_t             status;

  /* We only take the channel to ensure that ares_init() been called. */
  if (channel == NULL || name == NULL || host == NULL) {
    /* Anything will do, really.  This seems fine, and is consistent with
       other error cases. */
    if (host != NULL) {
      *host = NULL;
    }
    return ARES_ENOTFOUND;
  }

  *host  = NULL;

  /* Per RFC 7686, reject queries for ".onion" domain names with NXDOMAIN. */
  if (ares_is_onion_domain(name)) {
    return ARES_ENOTFOUND;
  }

  status = ares_hosts_search_host(channel, ARES_FALSE, name, &entry);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  status = ares_hosts_entry_to_hostent(entry, family, host);
  if (status != ARES_SUCCESS) {
    goto done; /* LCOV_EXCL_LINE: OutOfMemory */
  }

done:
  /* RFC6761 section 6.3 #3 states that "Name resolution APIs and libraries
   * SHOULD recognize localhost names as special and SHOULD always return the
   * IP loopback address for address queries".
   * We will also ignore ALL errors when trying to resolve localhost, such
   * as permissions errors reading /etc/hosts or a malformed /etc/hosts.
   *
   * Also, just because the query itself returned success from /etc/hosts
   * lookup doesn't mean it returned everything it needed to for all requested
   * address families. As long as we're not on a critical out of memory
   * condition pass it through to fill in any other address classes. */
  if (status != ARES_ENOMEM && ares_is_localhost(name)) {
    return ares_hostent_localhost(name, family, host);
  }

  return status;
}